

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
openjij::test::RESULT_GetSolutionFromTrotter_Test::TestBody
          (RESULT_GetSolutionFromTrotter_Test *this)

{
  float *pfVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  TransverseIsing<openjij::graph::Dense<float>_> *system;
  pointer *__ptr;
  char *message;
  long lVar3;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  TrotterSpins init_trotter_spins;
  Spins solution;
  Dense<float> graph;
  TransverseIsing<openjij::graph::Dense<float>_> q_sys;
  Xorshift r;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  allocator_type local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  AssertHelper local_100;
  TrotterSpins local_f8;
  Spins local_e0;
  Dense<float> local_c8;
  TransverseIsing<openjij::graph::Dense<float>_> local_a8;
  Xorshift local_38;
  
  openjij::graph::Dense<float>::Dense(&local_c8,4);
  pfVar1 = openjij::graph::Dense<float>::J(&local_c8,1,1);
  *pfVar1 = -1.0;
  pfVar1 = openjij::graph::Dense<float>::J(&local_c8,0,1);
  *pfVar1 = -1.0;
  pfVar1 = openjij::graph::Dense<float>::J(&local_c8,1,2);
  *pfVar1 = -1.0;
  pfVar1 = openjij::graph::Dense<float>::J(&local_c8,2,3);
  *pfVar1 = 1.0;
  local_38.x = 0x75bcd15;
  local_38.y = 0x159a55e5;
  local_38.z = 0x1f123bb5;
  local_38.w = 0x4d2;
  local_f8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = (vector<int,_std::allocator<int>_> *)operator_new(0x60);
  local_f8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar2 + 4;
  pvVar2[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar2[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar2[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar2[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pvVar2[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pvVar2[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar2[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar2[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar2[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lVar3 = 0;
  local_f8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pvVar2;
  local_f8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_f8.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  do {
    openjij::graph::Graph::gen_spin<openjij::utility::Xorshift>
              ((Spins *)&local_a8,&local_c8.super_Graph,&local_38);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar3),
               (vector<int,_std::allocator<int>_> *)&local_a8);
    if (local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
        m_storage.m_data != (float *)0x0) {
      operator_delete(local_a8.trotter_spins.
                      super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data,local_a8.trotter_spins.
                             super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols -
                             (long)local_a8.trotter_spins.
                                   super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x60);
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x100000001;
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0xffffffff00000001;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a8,__l,local_110);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (local_f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_a8);
  if (local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
      m_storage.m_data != (float *)0x0) {
    operator_delete(local_a8.trotter_spins.
                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data
                    ,local_a8.trotter_spins.
                     super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols - (long)local_a8.trotter_spins.
                                    super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                                    m_storage.m_data);
  }
  openjij::system::TransverseIsing<openjij::graph::Dense<float>_>::TransverseIsing
            (&local_a8,&local_f8,&local_c8,1.0);
  openjij::result::get_solution<openjij::graph::Dense<float>>(&local_e0,(result *)&local_a8,system);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)local_110,"solution","init_trotter_spins[0]",&local_e0,
             local_f8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_110[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_118);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/result/result.hpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_118._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_a8.dE.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  free(local_a8.rand_pool.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_a8.interaction.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.
       m_storage.m_data);
  free(local_a8.trotter_spins.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_f8);
  free(local_c8._J.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>.m_storage.m_data)
  ;
  return;
}

Assistant:

TEST(RESULT, GetSolutionFromTrotter){
   auto graph = openjij::graph::Dense<float>(4);
   graph.J(1, 1) = -1.0;
   graph.J(0, 1) = -1.0;
   graph.J(1, 2) = -1.0;
   graph.J(2, 3) = 1.0;
   
   auto r = openjij::utility::Xorshift(1234);
   int num_trotter_slices = 4;
   openjij::system::TrotterSpins init_trotter_spins(num_trotter_slices);
   for(auto& spins : init_trotter_spins){
      spins = graph.gen_spin(r);
   }
   
   init_trotter_spins[0] = openjij::graph::Spins({1, 1, 1, -1});
   
   auto q_sys = openjij::system::make_transverse_ising(init_trotter_spins, graph, 1.0);
   // get_solution get minimum energy state
   auto solution = openjij::result::get_solution(q_sys);
   EXPECT_EQ(solution, init_trotter_spins[0]);
}